

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O1

size_t __thiscall
gui::MultilineTextBox::findCaretOffset(MultilineTextBox *this,Vector2<unsigned_long> *caretPosition)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  uVar5 = ((long)(this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 5) - 1;
  if (caretPosition->y <= uVar5) {
    uVar5 = caretPosition->y;
  }
  if (uVar5 == 0) {
    lVar3 = 0;
  }
  else {
    lVar4 = 0;
    lVar3 = 0;
    uVar2 = uVar5;
    do {
      sVar1 = sf::String::getSize((String *)
                                  ((long)&(((this->boxStrings_).
                                            super__Vector_base<sf::String,_std::allocator<sf::String>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_string).
                                          _M_dataplus._M_p + lVar4));
      lVar3 = lVar3 + sVar1 + 1;
      lVar4 = lVar4 + 0x20;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  sVar1 = sf::String::getSize((this->boxStrings_).
                              super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                              super__Vector_impl_data._M_start + uVar5);
  if (caretPosition->x <= sVar1) {
    sVar1 = caretPosition->x;
  }
  return sVar1 + lVar3;
}

Assistant:

size_t MultilineTextBox::findCaretOffset(const sf::Vector2<size_t>& caretPosition) const {
    size_t pos = 0;
    size_t y = std::min(caretPosition.y, boxStrings_.size() - 1);
    for (size_t i = 0; i < y; ++i) {
        pos += boxStrings_[i].getSize() + 1;
    }
    return pos + std::min(caretPosition.x, boxStrings_[y].getSize());
}